

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

size_t n_occurences_s(int *array,size_t length,int needle)

{
  bool bVar1;
  ulong local_30;
  size_t i;
  size_t sum;
  int needle_local;
  size_t length_local;
  int *array_local;
  
  i = 0;
  local_30 = 0;
  while( true ) {
    bVar1 = false;
    if (local_30 < length) {
      bVar1 = array[local_30] <= needle;
    }
    if (!bVar1) break;
    if (array[local_30] == needle) {
      i = i + 1;
    }
    local_30 = local_30 + 1;
  }
  return i;
}

Assistant:

size_t n_occurences_s(const int* array, const size_t length, const int needle) {
  size_t sum = 0;
  for (size_t i = 0; i < length && array[i] <= needle; i++) {
    if (array[i] == needle) {
      sum++;
    }
  }
  return sum;
}